

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmldoc.cpp
# Opt level: O0

void __thiscall libcellml::XmlDoc::~XmlDoc(XmlDoc *this)

{
  XmlDocImpl *this_00;
  XmlDoc *this_local;
  
  if (this->mPimpl->mXmlDocPtr != (xmlDocPtr)0x0) {
    xmlFreeDoc(this->mPimpl->mXmlDocPtr);
  }
  this_00 = this->mPimpl;
  if (this_00 != (XmlDocImpl *)0x0) {
    XmlDocImpl::~XmlDocImpl(this_00);
    operator_delete(this_00,0x28);
  }
  return;
}

Assistant:

XmlDoc::~XmlDoc()
{
    if (mPimpl->mXmlDocPtr != nullptr) {
        xmlFreeDoc(mPimpl->mXmlDocPtr);
    }
    delete mPimpl;
}